

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O0

_Bool COSE_Encrypt_decrypt(HCOSE_ENCRYPT h,byte *pbKey,size_t cbKey,cose_errback *perr)

{
  _Bool _Var1;
  _Bool f;
  COSE_Encrypt *pcose;
  cose_errback *perr_local;
  size_t cbKey_local;
  byte *pbKey_local;
  HCOSE_ENCRYPT h_local;
  
  _Var1 = IsValidEncryptHandle(h);
  if (_Var1) {
    h_local._7_1_ =
         _COSE_Enveloped_decrypt
                   ((COSE_Enveloped *)h,(COSE_RecipientInfo *)0x0,pbKey,cbKey,"Encrypt0",perr);
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
    h_local._7_1_ = false;
  }
  return h_local._7_1_;
}

Assistant:

bool COSE_Encrypt_decrypt(HCOSE_ENCRYPT h, const byte * pbKey, size_t cbKey, cose_errback * perr)
{
	COSE_Encrypt * pcose = (COSE_Encrypt *)h;
	bool f;

	if (!IsValidEncryptHandle(h)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;
		return false;
	}

	f = _COSE_Enveloped_decrypt(pcose, NULL, pbKey, cbKey, "Encrypt0", perr);
	return f;
}